

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::MemoryModuleField::~MemoryModuleField(MemoryModuleField *this)

{
  pointer pcVar1;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__MemoryModuleField_0019ba28;
  pcVar1 = (this->memory).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->memory).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit MemoryModuleField(const Location& loc = Location(),
                             string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Memory>(loc), memory(name) {}